

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<float> * __thiscall
cimg_library::CImg<float>::get_projections2d
          (CImg<float> *__return_storage_ptr__,CImg<float> *this,uint x0,uint y0,uint z0)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint size_c;
  bool bVar4;
  CImg<float> *pCVar5;
  float *a;
  float *b;
  float *c;
  type value;
  uint local_124;
  uint local_120;
  uint local_11c;
  CImg<float> local_100;
  CImg<float> local_e0;
  undefined1 local_c0 [8];
  CImg<float> img_xz;
  CImg<float> local_90;
  undefined1 local_70 [8];
  CImg<float> img_zy;
  CImg<float> img_xy;
  uint _z0;
  uint _y0;
  uint _x0;
  uint z0_local;
  uint y0_local;
  uint x0_local;
  CImg<float> *this_local;
  
  bVar4 = is_empty(this);
  if ((bVar4) || (this->_depth < 2)) {
    operator+(__return_storage_ptr__,this);
  }
  else {
    local_11c = x0;
    if (this->_width <= x0) {
      local_11c = this->_width - 1;
    }
    local_120 = y0;
    if (this->_height <= y0) {
      local_120 = this->_height - 1;
    }
    local_124 = z0;
    if (this->_depth <= z0) {
      local_124 = this->_depth - 1;
    }
    get_crop((CImg<float> *)&img_zy._data,this,0,0,local_124,0,this->_width - 1,this->_height - 1,
             local_124,this->_spectrum - 1,false);
    get_crop(&local_90,this,local_11c,0,0,0,local_11c,this->_height - 1,this->_depth - 1,
             this->_spectrum - 1,false);
    pCVar5 = permute_axes(&local_90,"xzyc");
    pCVar5 = resize(pCVar5,this->_depth,this->_height,1,-100,-1,0,0.0,0.0,0.0,0.0);
    CImg((CImg<float> *)local_70,pCVar5);
    ~CImg(&local_90);
    get_crop(&local_e0,this,0,local_120,0,0,this->_width - 1,local_120,this->_depth - 1,
             this->_spectrum - 1,false);
    pCVar5 = resize(&local_e0,this->_width,this->_depth,1,-100,-1,0,0.0,0.0,0.0,0.0);
    CImg((CImg<float> *)local_c0,pCVar5);
    ~CImg(&local_e0);
    uVar1 = this->_depth;
    uVar2 = this->_width;
    uVar3 = this->_height;
    size_c = this->_spectrum;
    a = min((CImg<float> *)&img_zy._data);
    b = min((CImg<float> *)local_70);
    c = min((CImg<float> *)local_c0);
    value = cimg::min<float,float,float>(a,b,c);
    CImg(&local_100,uVar2 + uVar1,uVar3 + uVar1,1,size_c,value);
    pCVar5 = draw_image<float>(&local_100,0,0,(CImg<float> *)&img_zy._data,1.0);
    pCVar5 = draw_image<float>(pCVar5,(int)img_zy._data,0,(CImg<float> *)local_70,1.0);
    pCVar5 = draw_image<float>(pCVar5,0,img_zy._data._4_4_,(CImg<float> *)local_c0,1.0);
    CImg(__return_storage_ptr__,pCVar5);
    ~CImg(&local_100);
    ~CImg((CImg<float> *)local_c0);
    ~CImg((CImg<float> *)local_70);
    ~CImg((CImg<float> *)&img_zy._data);
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<T> get_projections2d(const unsigned int x0, const unsigned int y0, const unsigned int z0) const {
      if (is_empty() || _depth<2) return +*this;
      const unsigned int
        _x0 = (x0>=_width)?_width - 1:x0,
        _y0 = (y0>=_height)?_height - 1:y0,
        _z0 = (z0>=_depth)?_depth - 1:z0;
      const CImg<T>
        img_xy = get_crop(0,0,_z0,0,_width-1,_height-1,_z0,_spectrum-1),
        img_zy = get_crop(_x0,0,0,0,_x0,_height-1,_depth-1,_spectrum-1).permute_axes("xzyc").resize(_depth,_height,1,-100,-1),
        img_xz = get_crop(0,_y0,0,0,_width-1,_y0,_depth-1,_spectrum-1).resize(_width,_depth,1,-100,-1);
      return CImg<T>(_width + _depth,_height + _depth,1,_spectrum,cimg::min(img_xy.min(),img_zy.min(),img_xz.min())).
        draw_image(0,0,img_xy).draw_image(img_xy._width,0,img_zy).
        draw_image(0,img_xy._height,img_xz);
    }